

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool chck_string_set_cstr_with_length(chck_string *string,char *data,size_t len,_Bool is_heap)

{
  char *local_40;
  char *local_38;
  char *copy;
  _Bool is_heap_local;
  size_t len_local;
  char *data_local;
  chck_string *string_local;
  
  if (string == (chck_string *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/string/string.c"
                  ,0x21,
                  "_Bool chck_string_set_cstr_with_length(struct chck_string *, const char *, size_t, _Bool)"
                 );
  }
  local_38 = data;
  if ((((is_heap) && (data != (char *)0x0)) && (len != 0)) &&
     (local_38 = ccopy(data,len), local_38 == (char *)0x0)) {
    return false;
  }
  chck_string_release(string);
  string->is_heap = is_heap;
  if (len == 0) {
    local_40 = (char *)0x0;
  }
  else {
    local_40 = local_38;
  }
  string->data = local_40;
  string->size = len;
  return true;
}

Assistant:

bool
chck_string_set_cstr_with_length(struct chck_string *string, const char *data, size_t len, bool is_heap)
{
   assert(string);

   char *copy = (char*)data;
   if (is_heap && data && len > 0 && !(copy = ccopy(data, len)))
      return false;

   chck_string_release(string);
   string->is_heap = is_heap;
   string->data = (len > 0 ? copy : NULL);
   string->size = len;
   return true;
}